

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_cmd.c
# Opt level: O2

int cfg_cmd_handle_schema(cfg_db *db,char *arg,autobuf *log)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  avl_node *paVar4;
  size_t sVar5;
  cfg_schema *pcVar6;
  avl_node *paVar7;
  void *pvVar8;
  avl_node *paVar9;
  avl_tree *tree;
  char *pcVar10;
  list_entity *plVar11;
  avl_node *__s;
  cfg_schema *pcVar12;
  char *local_40;
  char *local_38;
  
  pcVar6 = db->schema;
  if (pcVar6 == (cfg_schema *)0x0) {
    abuf_puts(log,"Internal error, database not connected to schema\n");
    iVar1 = -1;
  }
  else if ((arg == (char *)0x0) || (*arg == '\0')) {
    abuf_puts(log,
              "List of section types:\n(use this command with the types as parameter for more information)\n"
             );
    pcVar6 = db->schema;
    pcVar12 = pcVar6;
    while (pcVar12 = (cfg_schema *)(pcVar12->sections).list_head.next,
          (pcVar12->sections).list_head.prev != (pcVar6->sections).list_head.prev) {
      if (*(char *)((long)&(pcVar12->entries).list_head.prev + 1) == '\0') {
        plVar11 = (pcVar12->handlers).next;
        pcVar2 = ": ";
        if (plVar11 == (list_entity *)0x0) {
          pcVar2 = "";
          plVar11 = (list_entity *)0x1397da;
        }
        cfg_append_printable_line
                  (log,"    %s (%s)%s%s",(pcVar12->entries).root,
                   CFG_SCHEMA_SECTIONMODE[*(uint *)&(pcVar12->entries).comp],pcVar2,plVar11);
      }
      else if ((pcVar12->handlers).next != (list_entity *)0x0) {
        cfg_append_printable_line(log,"        %s");
      }
      pcVar6 = db->schema;
    }
LAB_00126e59:
    iVar1 = 0;
  }
  else {
    iVar1 = strcmp(arg,"all");
    if (iVar1 == 0) {
      paVar9 = (avl_node *)0x0;
      pcVar12 = pcVar6;
      do {
        plVar11 = (pcVar6->sections).list_head.prev;
        do {
          pcVar12 = (cfg_schema *)(pcVar12->sections).list_head.next;
          if ((pcVar12->sections).list_head.prev == plVar11) goto LAB_00126e59;
          if (paVar9 == (avl_node *)0x0) goto LAB_00126e40;
          iVar1 = strcasecmp((char *)(pcVar12->entries).root,(char *)paVar9);
        } while (iVar1 == 0);
        abuf_puts(log,"\n");
LAB_00126e40:
        _print_schema_section(log,db,(char *)(pcVar12->entries).root);
        paVar9 = (pcVar12->entries).root;
        pcVar6 = db->schema;
      } while( true );
    }
    pcVar2 = strdup(arg);
    pcVar3 = strchr(pcVar2,0x2e);
    if (pcVar3 == (char *)0x0) {
      iVar1 = _print_schema_section(log,db,pcVar2);
    }
    else {
      local_38 = pcVar3 + 1;
      *pcVar3 = '\0';
      local_40 = pcVar2;
      paVar4 = avl_find(&db->schema->entries,&local_40);
      paVar7 = (avl_node *)0x0;
      for (paVar9 = paVar4;
          (tree = &db->schema->entries, paVar9 != (avl_node *)0x0 && (paVar9 != (avl_node *)tree));
          paVar9 = (avl_node *)(paVar9->list).next) {
        if (paVar9 == paVar4) {
          pcVar10 = "";
          pcVar3 = "";
          if (paVar9[1].left == (avl_node *)0x0) {
            pcVar3 = " (mandatory)";
          }
          if (paVar9[1].balance != '\0') {
            pcVar10 = " (list)";
          }
          cfg_append_printable_line(log,"    %s%s%s",paVar9[1].parent,pcVar3,pcVar10);
          if (paVar9[1].left != (avl_node *)0x0) {
            cfg_append_printable_line(log,"    Default value:");
            for (__s = paVar9[1].left;
                (__s != (avl_node *)0x0 &&
                (__s < (avl_node *)
                       ((long)&((paVar9[1].right)->list).next + (long)&((paVar9[1].left)->list).next
                       ))); __s = (avl_node *)((long)&(__s->list).next + sVar5 + 1)) {
              cfg_append_printable_line(log,"        \'%s\'",__s);
              sVar5 = strlen((char *)__s);
            }
          }
        }
        else if (paVar9->follower == false) break;
        plVar11 = paVar9[2].list.prev;
        if ((plVar11 != (list_entity *)0x0) &&
           (((paVar7 == (avl_node *)0x0 || (paVar7[2].list.prev != plVar11)) ||
            (iVar1 = bcmp(&paVar7[2].parent,&paVar9[2].parent,0x18), iVar1 != 0)))) {
          (*(code *)plVar11)(paVar9,log);
          paVar7 = paVar9;
        }
      }
      paVar7 = avl_find(tree,&local_40);
      for (paVar9 = paVar7;
          (paVar9 != (avl_node *)0x0 && (paVar9 != (avl_node *)&db->schema->entries));
          paVar9 = (avl_node *)(paVar9->list).next) {
        if (paVar9 == paVar7) {
          if (paVar9[1].key != (void *)0x0) {
            abuf_puts(log,"    Description:\n");
            pvVar8 = paVar9[1].key;
            goto LAB_00126de9;
          }
        }
        else {
          if (paVar9->follower == false) break;
          pvVar8 = paVar9[1].key;
          if (pvVar8 != (void *)0x0) {
LAB_00126de9:
            cfg_append_printable_line(log,"        %s",pvVar8);
          }
        }
      }
      iVar1 = 0;
    }
    free(pcVar2);
  }
  return iVar1;
}

Assistant:

int
cfg_cmd_handle_schema(struct cfg_db *db, const char *arg, struct autobuf *log) {
  struct cfg_schema_section *s_section;
  char *copy, *ptr;
  int result;

  if (db->schema == NULL) {
    abuf_puts(log, "Internal error, database not connected to schema\n");
    return -1;
  }

  if (arg == NULL || *arg == 0) {
    abuf_puts(log, "List of section types:\n"
                   "(use this command with the types as parameter for more information)\n");
    avl_for_each_element(&db->schema->sections, s_section, _section_node) {
      if (!s_section->_section_node.follower) {
        cfg_append_printable_line(log, CFG_HELP_INDENT_PREFIX "%s (%s)%s%s", s_section->type,
          CFG_SCHEMA_SECTIONMODE[s_section->mode], s_section->help ? ": " : "", s_section->help ? s_section->help : "");
      }
      else if (s_section->help) {
        cfg_append_printable_line(log, CFG_HELP_INDENT_PREFIX CFG_HELP_INDENT_PREFIX "%s", s_section->help);
      }
    }
    return 0;
  }

  if (strcmp(arg, "all") == 0) {
    const char *last_type = NULL;

    avl_for_each_element(&db->schema->sections, s_section, _section_node) {
      if (last_type == NULL || strcasecmp(s_section->type, last_type) != 0) {
        if (last_type != NULL) {
          abuf_puts(log, "\n");
        }
        _print_schema_section(log, db, s_section->type);
        last_type = s_section->type;
      }
    }
    return 0;
  }

  /* copy string into stack*/
  copy = strdup(arg);

  /* prepare for cleanup */
  result = -1;

  ptr = strchr(copy, '.');
  if (ptr) {
    *ptr++ = 0;
  }

  if (ptr == NULL) {
    result = _print_schema_section(log, db, copy);
  }
  else {
    result = _print_schema_entry(log, db, copy, ptr);
  }

  free(copy);
  return result;
}